

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

U32 HUF_setMaxHeight(nodeElt *huffNode,U32 lastNonNull,U32 maxNbBits)

{
  byte bVar1;
  char cVar2;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  bool bVar3;
  U32 lowTotal;
  U32 highTotal;
  U32 lowPos;
  U32 highPos;
  U32 nBitsToDecrease;
  U32 currentNbBits;
  int pos;
  U32 rankLast [14];
  U32 noSymbol;
  U32 n;
  U32 baseCost;
  int totalCost;
  U32 largestBits;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68 [15];
  undefined4 local_2c;
  uint local_28;
  int local_24;
  U32 local_20;
  uint local_1c;
  uint local_18;
  long local_10;
  uint local_4;
  
  bVar1 = *(byte *)(in_RDI + 7 + (ulong)in_ESI * 8);
  local_1c = (uint)bVar1;
  local_4 = local_1c;
  if (in_EDX < local_1c) {
    local_20 = 0;
    cVar2 = (char)in_EDX;
    local_24 = 1 << (bVar1 - cVar2 & 0x1f);
    local_28 = in_ESI;
    while (in_EDX < *(byte *)(in_RDI + 7 + (ulong)local_28 * 8)) {
      local_20 = (local_24 - (1 << (bVar1 - *(char *)(in_RDI + 7 + (ulong)local_28 * 8) & 0x1f))) +
                 local_20;
      *(char *)(in_RDI + 7 + (ulong)local_28 * 8) = cVar2;
      local_28 = local_28 - 1;
    }
    while (*(byte *)(in_RDI + 7 + (ulong)local_28 * 8) == in_EDX) {
      local_28 = local_28 - 1;
    }
    local_20 = (int)local_20 >> (bVar1 - cVar2 & 0x1f);
    local_2c = 0xf0f0f0f0;
    local_18 = in_EDX;
    local_10 = in_RDI;
    memset(local_68,0xf0,0x38);
    local_70 = local_18;
    for (local_6c = local_28; -1 < (int)local_6c; local_6c = local_6c - 1) {
      if (*(byte *)(local_10 + 7 + (long)(int)local_6c * 8) < local_70) {
        local_70 = (uint)*(byte *)(local_10 + 7 + (long)(int)local_6c * 8);
        local_68[local_18 - local_70] = local_6c;
      }
    }
    while (0 < (int)local_20) {
      local_74 = BIT_highbit32(local_20);
      for (local_74 = local_74 + 1; 1 < local_74; local_74 = local_74 - 1) {
        if ((local_68[local_74] != 0xf0f0f0f0) &&
           ((local_68[local_74 - 1] == 0xf0f0f0f0 ||
            (*(uint *)(local_10 + (ulong)local_68[local_74] * 8) <=
             (uint)(*(int *)(local_10 + (ulong)local_68[local_74 - 1] * 8) << 1))))) break;
      }
      while( true ) {
        bVar3 = false;
        if (local_74 < 0xd) {
          bVar3 = local_68[local_74] == 0xf0f0f0f0;
        }
        if (!bVar3) break;
        local_74 = local_74 + 1;
      }
      local_20 = local_20 - (1 << ((char)local_74 - 1U & 0x1f));
      if (local_68[local_74 - 1] == 0xf0f0f0f0) {
        local_68[local_74 - 1] = local_68[local_74];
      }
      *(char *)(local_10 + 7 + (ulong)local_68[local_74] * 8) =
           *(char *)(local_10 + 7 + (ulong)local_68[local_74] * 8) + '\x01';
      if (local_68[local_74] == 0) {
        local_68[local_74] = 0xf0f0f0f0;
      }
      else {
        local_68[local_74] = local_68[local_74] - 1;
        if ((uint)*(byte *)(local_10 + 7 + (ulong)local_68[local_74] * 8) != local_18 - local_74) {
          local_68[local_74] = 0xf0f0f0f0;
        }
      }
    }
    while ((int)local_20 < 0) {
      if (local_68[1] == -0xf0f0f10) {
        while (*(byte *)(local_10 + 7 + (ulong)local_28 * 8) == local_18) {
          local_28 = local_28 - 1;
        }
        *(char *)(local_10 + 7 + (ulong)(local_28 + 1) * 8) =
             *(char *)(local_10 + 7 + (ulong)(local_28 + 1) * 8) + -1;
        local_68[1] = local_28 + 1;
        local_20 = local_20 + 1;
      }
      else {
        *(char *)(local_10 + 7 + (ulong)(local_68[1] + 1) * 8) =
             *(char *)(local_10 + 7 + (ulong)(local_68[1] + 1) * 8) + -1;
        local_68[1] = local_68[1] + 1;
        local_20 = local_20 + 1;
      }
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

static U32 HUF_setMaxHeight(nodeElt* huffNode, U32 lastNonNull, U32 maxNbBits)
{
    const U32 largestBits = huffNode[lastNonNull].nbBits;
    if (largestBits <= maxNbBits) return largestBits;   /* early exit : no elt > maxNbBits */

    /* there are several too large elements (at least >= 2) */
    {   int totalCost = 0;
        const U32 baseCost = 1 << (largestBits - maxNbBits);
        U32 n = lastNonNull;

        while (huffNode[n].nbBits > maxNbBits) {
            totalCost += baseCost - (1 << (largestBits - huffNode[n].nbBits));
            huffNode[n].nbBits = (BYTE)maxNbBits;
            n --;
        }  /* n stops at huffNode[n].nbBits <= maxNbBits */
        while (huffNode[n].nbBits == maxNbBits) n--;   /* n end at index of smallest symbol using < maxNbBits */

        /* renorm totalCost */
        totalCost >>= (largestBits - maxNbBits);  /* note : totalCost is necessarily a multiple of baseCost */

        /* repay normalized cost */
        {   U32 const noSymbol = 0xF0F0F0F0;
            U32 rankLast[HUF_TABLELOG_MAX+2];
            int pos;

            /* Get pos of last (smallest) symbol per rank */
            memset(rankLast, 0xF0, sizeof(rankLast));
            {   U32 currentNbBits = maxNbBits;
                for (pos=n ; pos >= 0; pos--) {
                    if (huffNode[pos].nbBits >= currentNbBits) continue;
                    currentNbBits = huffNode[pos].nbBits;   /* < maxNbBits */
                    rankLast[maxNbBits-currentNbBits] = pos;
            }   }

            while (totalCost > 0) {
                U32 nBitsToDecrease = BIT_highbit32(totalCost) + 1;
                for ( ; nBitsToDecrease > 1; nBitsToDecrease--) {
                    U32 highPos = rankLast[nBitsToDecrease];
                    U32 lowPos = rankLast[nBitsToDecrease-1];
                    if (highPos == noSymbol) continue;
                    if (lowPos == noSymbol) break;
                    {   U32 const highTotal = huffNode[highPos].count;
                        U32 const lowTotal = 2 * huffNode[lowPos].count;
                        if (highTotal <= lowTotal) break;
                }   }
                /* only triggered when no more rank 1 symbol left => find closest one (note : there is necessarily at least one !) */
                /* HUF_MAX_TABLELOG test just to please gcc 5+; but it should not be necessary */
                while ((nBitsToDecrease<=HUF_TABLELOG_MAX) && (rankLast[nBitsToDecrease] == noSymbol))
                    nBitsToDecrease ++;
                totalCost -= 1 << (nBitsToDecrease-1);
                if (rankLast[nBitsToDecrease-1] == noSymbol)
                    rankLast[nBitsToDecrease-1] = rankLast[nBitsToDecrease];   /* this rank is no longer empty */
                huffNode[rankLast[nBitsToDecrease]].nbBits ++;
                if (rankLast[nBitsToDecrease] == 0)    /* special case, reached largest symbol */
                    rankLast[nBitsToDecrease] = noSymbol;
                else {
                    rankLast[nBitsToDecrease]--;
                    if (huffNode[rankLast[nBitsToDecrease]].nbBits != maxNbBits-nBitsToDecrease)
                        rankLast[nBitsToDecrease] = noSymbol;   /* this rank is now empty */
            }   }   /* while (totalCost > 0) */

            while (totalCost < 0) {  /* Sometimes, cost correction overshoot */
                if (rankLast[1] == noSymbol) {  /* special case : no rank 1 symbol (using maxNbBits-1); let's create one from largest rank 0 (using maxNbBits) */
                    while (huffNode[n].nbBits == maxNbBits) n--;
                    huffNode[n+1].nbBits--;
                    rankLast[1] = n+1;
                    totalCost++;
                    continue;
                }
                huffNode[ rankLast[1] + 1 ].nbBits--;
                rankLast[1]++;
                totalCost ++;
    }   }   }   /* there are several too large elements (at least >= 2) */

    return maxNbBits;
}